

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

void __thiscall
phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
::erase_same_node(btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                  *this,iterator _begin,iterator _end)

{
  btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_> bVar1;
  long lVar2;
  int iVar3;
  btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
  *pbVar4;
  int iVar5;
  ulong uVar6;
  btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
  *this_00;
  long lVar7;
  int iVar8;
  ulong uVar9;
  size_type sVar10;
  size_type i;
  
  this_00 = _begin.node;
  if (this_00 != _end.node) {
    __assert_fail("_begin.node == _end.node",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0xae5,
                  "void phmap::priv::btree<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, true>>::erase_same_node(iterator, iterator) [Params = phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, true>]"
                 );
  }
  iVar8 = _end.position;
  iVar5 = _begin.position;
  iVar3 = iVar8 - iVar5;
  if (iVar3 != 0 && iVar5 <= iVar8) {
    if (((undefined1  [16])_begin & (undefined1  [16])0x7) == (undefined1  [16])0x0) {
      uVar9 = (ulong)iVar3;
      sVar10 = (size_type)iVar5;
      if (this_00[0xb] ==
          (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
           )0x0) {
        if (iVar8 != iVar5) {
          uVar6 = 0;
          do {
            pbVar4 = btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                     ::child(this_00,sVar10 + 1 + uVar6);
            internal_clear(this,pbVar4);
            uVar6 = uVar6 + 1;
          } while (uVar6 < uVar9);
        }
        if (uVar9 + sVar10 + 1 <= (ulong)(byte)this_00[10]) {
          uVar6 = uVar9 + sVar10;
          i = sVar10;
          do {
            i = i + 1;
            uVar6 = uVar6 + 1;
            pbVar4 = btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                     ::child(this_00,uVar6);
            btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
            ::set_child(this_00,i,pbVar4);
            btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
            ::mutable_child(this_00,uVar6);
          } while (uVar6 < (byte)this_00[10]);
        }
      }
      lVar2 = sVar10 * 4 + 0xc;
      bVar1 = this_00[10];
      if (this_00 + uVar9 * 4 + lVar2 != this_00 + (ulong)(byte)bVar1 * 4 + 0xc) {
        lVar7 = 0;
        do {
          *(undefined4 *)(this_00 + lVar7 + lVar2) =
               *(undefined4 *)(this_00 + uVar9 * 4 + lVar2 + lVar7);
          lVar7 = lVar7 + 4;
        } while ((ulong)(byte)bVar1 * 4 + (long)iVar8 * -4 != lVar7);
      }
      this_00[10] = (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                     )((char)this_00[10] - (char)iVar3);
      return;
    }
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                  ,0xf84,
                  "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, true>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, true>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
                 );
  }
  __assert_fail("_end.position > _begin.position",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                ,0xae6,
                "void phmap::priv::btree<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, true>>::erase_same_node(iterator, iterator) [Params = phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, true>]"
               );
}

Assistant:

void btree<P>::erase_same_node(iterator _begin, iterator _end) {
        assert(_begin.node == _end.node);
        assert(_end.position > _begin.position);

        node_type *node = _begin.node;
        size_type to_erase = _end.position - _begin.position;
        if (!node->leaf()) {
            // Delete all children between _begin and _end.
            for (size_type i = 0; i < to_erase; ++i) {
                internal_clear(node->child(_begin.position + i + 1));
            }
            // Rotate children after _end into new positions.
            for (size_type i = _begin.position + to_erase + 1; i <= node->count(); ++i) {
                node->set_child(i - to_erase, node->child(i));
                node->clear_child(i);
            }
        }
        node->remove_values_ignore_children(_begin.position, to_erase,
                                            mutable_allocator());

        // Do not need to update rightmost_, because
        // * either _end == this->end(), and therefore node == rightmost_, and still
        //   exists
        // * or _end != this->end(), and therefore rightmost_ hasn't been erased, since
        //   it wasn't covered in [_begin, _end)
    }